

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

double get_kf_boost_score(AV1_COMP *cpi,double kf_raw_err,double *zero_motion_accumulator,
                         double *sr_accumulator,int use_avg_stat)

{
  AV1_PRIMARY *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  uint uVar14;
  uint uVar15;
  FIRSTPASS_STATS *pFVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  FIRSTPASS_STATS cur_frame;
  double local_230;
  undefined1 local_210 [16];
  double dStack_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 auStack_1c8 [16];
  undefined1 auStack_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_128 [16];
  FIRSTPASS_STATS local_118;
  
  pAVar1 = cpi->ppi;
  memset(local_210,0,0xe8);
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    dVar20 = (double)(cpi->rc).frames_to_key;
    dVar20 = dVar20 + dVar20;
    local_128 = ZEXT816(0x4054000000000000);
    if (80.0 < dVar20) {
      local_128._8_8_ = 0;
      local_128._0_8_ =
           -(ulong)(dVar20 < 128.0) & 0x4054000000000000 |
           ~-(ulong)(dVar20 < 128.0) & 0x4060000000000000;
    }
    if (80.0 < dVar20 && dVar20 < 128.0) {
      local_128._8_8_ = 0;
      local_128._0_8_ = dVar20;
    }
  }
  else {
    local_128 = ZEXT816(0x4060000000000000);
  }
  if (use_avg_stat == 0) {
    iVar17 = (cpi->rc).frames_to_key;
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    memset(&local_118,0,0xe8);
    iVar17 = (cpi->rc).frames_to_key;
    if (1 < iVar17) {
      pFVar16 = (cpi->twopass_frame).stats_in;
      uVar15 = 0;
      if (pFVar16 < ((pAVar1->twopass).stats_buf_ctx)->stats_in_end) {
        uVar14 = 1;
        do {
          uVar15 = uVar14;
          memcpy(&local_118,pFVar16,0xe8);
          (cpi->twopass_frame).stats_in = pFVar16 + 1;
          av1_accumulate_stats((FIRSTPASS_STATS *)local_210,&local_118);
          iVar17 = (cpi->rc).frames_to_key;
          if (iVar17 + -1 <= (int)uVar15) break;
          pFVar16 = (cpi->twopass_frame).stats_in;
          uVar14 = uVar15 + 1;
        } while (pFVar16 < ((pAVar1->twopass).stats_buf_ctx)->stats_in_end);
      }
      if (1 < uVar15) {
        dVar20 = (double)(int)uVar15;
        uVar18 = SUB84(dVar20,0);
        uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
        auVar2._8_4_ = uVar18;
        auVar2._0_8_ = dVar20;
        auVar2._12_4_ = uVar19;
        register0x00001240 = divpd(stack0xfffffffffffffdf8,auVar2);
        auVar3._8_4_ = uVar18;
        auVar3._0_8_ = dVar20;
        auVar3._12_4_ = uVar19;
        local_1f8 = divpd(local_1f8,auVar3);
        auVar4._8_4_ = uVar18;
        auVar4._0_8_ = dVar20;
        auVar4._12_4_ = uVar19;
        local_1e8 = divpd(local_1e8,auVar4);
        auVar5._8_4_ = uVar18;
        auVar5._0_8_ = dVar20;
        auVar5._12_4_ = uVar19;
        local_1d8 = divpd(local_1d8,auVar5);
        auVar6._8_4_ = uVar18;
        auVar6._0_8_ = dVar20;
        auVar6._12_4_ = uVar19;
        auStack_1c8 = divpd(auStack_1c8,auVar6);
        auVar7._8_4_ = uVar18;
        auVar7._0_8_ = dVar20;
        auVar7._12_4_ = uVar19;
        auStack_1b8 = divpd(auStack_1b8,auVar7);
        auVar8._8_4_ = uVar18;
        auVar8._0_8_ = dVar20;
        auVar8._12_4_ = uVar19;
        local_1a8 = divpd(local_1a8,auVar8);
        auVar9._8_4_ = uVar18;
        auVar9._0_8_ = dVar20;
        auVar9._12_4_ = uVar19;
        local_198 = divpd(local_198,auVar9);
        auVar10._8_4_ = uVar18;
        auVar10._0_8_ = dVar20;
        auVar10._12_4_ = uVar19;
        local_188 = divpd(local_188,auVar10);
        auVar11._8_4_ = uVar18;
        auVar11._0_8_ = dVar20;
        auVar11._12_4_ = uVar19;
        local_178 = divpd(local_178,auVar11);
        auVar12._8_4_ = uVar18;
        auVar12._0_8_ = dVar20;
        auVar12._12_4_ = uVar19;
        local_168 = divpd(local_168,auVar12);
      }
    }
  }
  local_230 = 0.0;
  if ((int)uVar15 < iVar17 + -1) {
    local_230 = 0.0;
    do {
      if (use_avg_stat == 0) {
        pFVar16 = (cpi->twopass_frame).stats_in;
        if (((pAVar1->twopass).stats_buf_ctx)->stats_in_end <= pFVar16) {
          return local_230;
        }
        memcpy(local_210,pFVar16,0xe8);
        (cpi->twopass_frame).stats_in = pFVar16 + 1;
      }
      if (uVar15 == 0) {
        dVar20 = (double)local_1e8._8_8_ - (double)local_1d8._0_8_;
      }
      else {
        dVar20 = *zero_motion_accumulator;
        dVar13 = (double)local_1e8._8_8_ - (double)local_1d8._0_8_;
        dVar21 = get_sr_decay_rate((FIRSTPASS_STATS *)local_210);
        if (dVar13 <= dVar21) {
          dVar21 = dVar13;
        }
        if (dVar21 <= dVar20) {
          dVar20 = dVar21;
        }
      }
      *zero_motion_accumulator = dVar20;
      if ((*sr_accumulator <= kf_raw_err * 1.5 && kf_raw_err * 1.5 != *sr_accumulator) &&
         ((int)uVar15 <= (cpi->rc).max_gf_interval * 2)) {
        if (uVar15 < 2) {
          *sr_accumulator = 0.0;
        }
        dVar13 = av1_convert_qindex_to_q
                           ((cpi->ppi->p_rc).avg_frame_qindex[1],(cpi->frame_info).bit_depth);
        dVar22 = 1.0 - (((double)auStack_1b8._0_8_ * 2.0) / (double)(cpi->frame_info).mb_rows +
                       (double)auStack_1c8._8_8_ * 0.5);
        dVar21 = 1.0;
        if (dVar22 <= 1.0) {
          dVar21 = dVar22;
        }
        dVar23 = (double)(-(ulong)(dVar22 < 0.5) & 0x3fe0000000000000 |
                         ~-(ulong)(dVar22 < 0.5) & (ulong)dVar21);
        dVar24 = ((double)local_1f8._8_8_ + *sr_accumulator) * dVar23;
        dVar21 = *(double *)(&DAT_004dfff0 + (ulong)(dVar24 < 0.0) * 8);
        dVar22 = *(double *)
                  (&DAT_00502b00 +
                  (ulong)((uint)((cpi->frame_info).frame_height * (cpi->frame_info).frame_width) <
                         0x38401) * 8) * dVar23;
        if (*(double *)
             (&DAT_00502b00 +
             (ulong)((uint)((cpi->frame_info).frame_height * (cpi->frame_info).frame_width) <
                    0x38401) * 8) * dVar23 <= dStack_200 * dVar23) {
          dVar22 = dStack_200 * dVar23;
        }
        dVar25 = ((double)local_1e8._0_8_ - (double)local_1f8._8_8_) + *sr_accumulator;
        dVar23 = 0.0;
        if (0.0 <= dVar25) {
          dVar23 = dVar25;
        }
        *sr_accumulator = dVar23;
        dVar13 = dVar13 * 0.015 + 0.5;
        if (2.0 <= dVar13) {
          dVar13 = 2.0;
        }
        dVar21 = (dVar22 / (dVar24 + dVar21) + 40.0) * dVar13;
        if (dVar13 * (double)local_128._0_8_ <= dVar21) {
          dVar21 = dVar13 * (double)local_128._0_8_;
        }
        local_230 = local_230 + dVar21 * (dVar20 * 0.5 + 0.75);
        iVar17 = (cpi->rc).frames_to_key;
      }
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 < iVar17 + -1);
  }
  return local_230;
}

Assistant:

static double get_kf_boost_score(AV1_COMP *cpi, double kf_raw_err,
                                 double *zero_motion_accumulator,
                                 double *sr_accumulator, int use_avg_stat) {
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  FIRSTPASS_STATS frame_stat;
  av1_zero(frame_stat);
  int i = 0, num_stat_used = 0;
  double boost_score = 0.0;
  const double kf_max_boost =
      cpi->oxcf.rc_cfg.mode == AOM_Q
          ? AOMMIN(AOMMAX(rc->frames_to_key * 2.0, KF_MIN_FRAME_BOOST),
                   KF_MAX_FRAME_BOOST)
          : KF_MAX_FRAME_BOOST;

  // Calculate the average using available number of stats.
  if (use_avg_stat) num_stat_used = calc_avg_stats(cpi, &frame_stat);

  for (i = num_stat_used; i < (rc->frames_to_key - 1); ++i) {
    if (!use_avg_stat &&
        EOF == input_stats(twopass, &cpi->twopass_frame, &frame_stat))
      break;

    // Monitor for static sections.
    // For the first frame in kf group, the second ref indicator is invalid.
    if (i > 0) {
      *zero_motion_accumulator =
          AOMMIN(*zero_motion_accumulator, get_zero_motion_factor(&frame_stat));
    } else {
      *zero_motion_accumulator = frame_stat.pcnt_inter - frame_stat.pcnt_motion;
    }

    // Not all frames in the group are necessarily used in calculating boost.
    if ((*sr_accumulator < (kf_raw_err * 1.50)) &&
        (i <= rc->max_gf_interval * 2)) {
      double frame_boost;
      double zm_factor;

      // Factor 0.75-1.25 based on how much of frame is static.
      zm_factor = (0.75 + (*zero_motion_accumulator / 2.0));

      if (i < 2) *sr_accumulator = 0.0;
      frame_boost =
          calc_kf_frame_boost(&cpi->ppi->p_rc, frame_info, &frame_stat,
                              sr_accumulator, kf_max_boost);
      boost_score += frame_boost * zm_factor;
    }
  }
  return boost_score;
}